

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

int __thiscall QVariant::toInt(QVariant *this,bool *ok)

{
  int iVar1;
  bool *in_RDI;
  Private *unaff_retaddr;
  
  iVar1 = qNumVariantToHelper<int>(unaff_retaddr,in_RDI);
  return iVar1;
}

Assistant:

int QVariant::toInt(bool *ok) const
{
    return qNumVariantToHelper<int>(d, ok);
}